

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaFacetPtr
xmlSchemaParseFacet(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaValidityErrorFunc p_Var2;
  xmlChar *str1;
  xmlSchemaAnnotPtr pxVar3;
  xmlChar *fixed;
  xmlChar *value;
  xmlNodePtr child;
  xmlSchemaFacetPtr facet;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlSchemaParserCtxtPtr)xmlSchemaNewFacet();
    if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(ctxt,"allocating facet",node);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      ctxt_local->serror = (xmlStructuredErrorFunc)node;
      p_Var2 = (xmlSchemaValidityErrorFunc)xmlSchemaGetProp(ctxt,node,"value");
      if (p_Var2 == (xmlSchemaValidityErrorFunc)0x0) {
        xmlSchemaPErr2(ctxt,node,(xmlNodePtr)0x0,0x6ac,"Facet %s has no value\n",node->name,
                       (xmlChar *)0x0);
        xmlSchemaFreeFacet((xmlSchemaFacetPtr)ctxt_local);
        ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
      else {
        if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
           ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"minInclusive"), iVar1 == 0 ||
            (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)))) {
          if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
             ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"minExclusive"), iVar1 == 0 ||
              (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)))) {
            if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                (iVar1 = xmlStrEqual(node->name,(xmlChar *)"maxInclusive"), iVar1 == 0)) ||
               (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)) {
              if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                 ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"maxExclusive"), iVar1 == 0 ||
                  (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)))) {
                if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                   ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"totalDigits"), iVar1 == 0 ||
                    (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)))) {
                  if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                      (iVar1 = xmlStrEqual(node->name,(xmlChar *)"fractionDigits"), iVar1 == 0)) ||
                     (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)) {
                    if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                       ((iVar1 = xmlStrEqual(node->name,"pattern"), iVar1 == 0 ||
                        (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)))) {
                      if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                         ((iVar1 = xmlStrEqual(node->name,"enumeration"), iVar1 == 0 ||
                          (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)))) {
                        if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                            (iVar1 = xmlStrEqual(node->name,(xmlChar *)"whiteSpace"), iVar1 == 0))
                           || (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)) {
                          if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                             ((iVar1 = xmlStrEqual(node->name,"length"), iVar1 == 0 ||
                              (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)))) {
                            if (((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                               ((iVar1 = xmlStrEqual(node->name,(xmlChar *)"maxLength"), iVar1 == 0
                                || (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0))))
                            {
                              if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
                                  (iVar1 = xmlStrEqual(node->name,(xmlChar *)"minLength"),
                                  iVar1 == 0)) ||
                                 (iVar1 = xmlStrEqual(node->ns->href,xmlSchemaNs), iVar1 == 0)) {
                                xmlSchemaPErr2(ctxt,node,(xmlNodePtr)0x0,0x6cd,
                                               "Unknown facet type %s\n",node->name,(xmlChar *)0x0);
                                xmlSchemaFreeFacet((xmlSchemaFacetPtr)ctxt_local);
                                return (xmlSchemaFacetPtr)0x0;
                              }
                              ctxt_local->type = XML_SCHEMA_FACET_MINLENGTH;
                            }
                            else {
                              ctxt_local->type = XML_SCHEMA_FACET_MAXLENGTH;
                            }
                          }
                          else {
                            ctxt_local->type = XML_SCHEMA_FACET_LENGTH;
                          }
                        }
                        else {
                          ctxt_local->type = XML_SCHEMA_FACET_WHITESPACE;
                        }
                      }
                      else {
                        ctxt_local->type = XML_SCHEMA_FACET_ENUMERATION;
                      }
                    }
                    else {
                      ctxt_local->type = XML_SCHEMA_FACET_PATTERN;
                    }
                  }
                  else {
                    ctxt_local->type = XML_SCHEMA_FACET_FRACTIONDIGITS;
                  }
                }
                else {
                  ctxt_local->type = XML_SCHEMA_FACET_TOTALDIGITS;
                }
              }
              else {
                ctxt_local->type = XML_SCHEMA_FACET_MAXEXCLUSIVE;
              }
            }
            else {
              ctxt_local->type = XML_SCHEMA_FACET_MAXINCLUSIVE;
            }
          }
          else {
            ctxt_local->type = XML_SCHEMA_FACET_MINEXCLUSIVE;
          }
        }
        else {
          ctxt_local->type = XML_SCHEMA_FACET_MININCLUSIVE;
        }
        xmlSchemaPValAttrID(ctxt,node,"id");
        ctxt_local->error = p_Var2;
        if (((ctxt_local->type != XML_SCHEMA_FACET_PATTERN) &&
            (ctxt_local->type != XML_SCHEMA_FACET_ENUMERATION)) &&
           ((str1 = xmlSchemaGetProp(ctxt,node,"fixed"), str1 != (xmlChar *)0x0 &&
            (iVar1 = xmlStrEqual(str1,(xmlChar *)"true"), iVar1 != 0)))) {
          *(int *)&ctxt_local->constructor = 1;
        }
        value = (xmlChar *)node->children;
        if ((((xmlNodePtr)value != (xmlNodePtr)0x0) && (((xmlNodePtr)value)->ns != (xmlNs *)0x0)) &&
           ((iVar1 = xmlStrEqual(((xmlNodePtr)value)->name,"annotation"), iVar1 != 0 &&
            (iVar1 = xmlStrEqual(((xmlNodePtr)value)->ns->href,xmlSchemaNs), iVar1 != 0)))) {
          pxVar3 = xmlSchemaParseAnnotation(ctxt,(xmlNodePtr)value,1);
          *(xmlSchemaAnnotPtr *)&ctxt_local->err = pxVar3;
          value = (xmlChar *)((xmlNodePtr)value)->next;
        }
        if (value != (xmlChar *)0x0) {
          xmlSchemaPErr2(ctxt,node,(xmlNodePtr)value,0x6cc,"Facet %s has unexpected child content\n"
                         ,node->name,(xmlChar *)0x0);
        }
      }
    }
  }
  return (xmlSchemaFacetPtr)ctxt_local;
}

Assistant:

static xmlSchemaFacetPtr
xmlSchemaParseFacet(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                    xmlNodePtr node)
{
    xmlSchemaFacetPtr facet;
    xmlNodePtr child = NULL;
    const xmlChar *value;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    facet = xmlSchemaNewFacet();
    if (facet == NULL) {
        xmlSchemaPErrMemory(ctxt, "allocating facet", node);
        return (NULL);
    }
    facet->node = node;
    value = xmlSchemaGetProp(ctxt, node, "value");
    if (value == NULL) {
        xmlSchemaPErr2(ctxt, node, child, XML_SCHEMAP_FACET_NO_VALUE,
                       "Facet %s has no value\n", node->name, NULL);
        xmlSchemaFreeFacet(facet);
        return (NULL);
    }
    if (IS_SCHEMA(node, "minInclusive")) {
        facet->type = XML_SCHEMA_FACET_MININCLUSIVE;
    } else if (IS_SCHEMA(node, "minExclusive")) {
        facet->type = XML_SCHEMA_FACET_MINEXCLUSIVE;
    } else if (IS_SCHEMA(node, "maxInclusive")) {
        facet->type = XML_SCHEMA_FACET_MAXINCLUSIVE;
    } else if (IS_SCHEMA(node, "maxExclusive")) {
        facet->type = XML_SCHEMA_FACET_MAXEXCLUSIVE;
    } else if (IS_SCHEMA(node, "totalDigits")) {
        facet->type = XML_SCHEMA_FACET_TOTALDIGITS;
    } else if (IS_SCHEMA(node, "fractionDigits")) {
        facet->type = XML_SCHEMA_FACET_FRACTIONDIGITS;
    } else if (IS_SCHEMA(node, "pattern")) {
        facet->type = XML_SCHEMA_FACET_PATTERN;
    } else if (IS_SCHEMA(node, "enumeration")) {
        facet->type = XML_SCHEMA_FACET_ENUMERATION;
    } else if (IS_SCHEMA(node, "whiteSpace")) {
        facet->type = XML_SCHEMA_FACET_WHITESPACE;
    } else if (IS_SCHEMA(node, "length")) {
        facet->type = XML_SCHEMA_FACET_LENGTH;
    } else if (IS_SCHEMA(node, "maxLength")) {
        facet->type = XML_SCHEMA_FACET_MAXLENGTH;
    } else if (IS_SCHEMA(node, "minLength")) {
        facet->type = XML_SCHEMA_FACET_MINLENGTH;
    } else {
        xmlSchemaPErr2(ctxt, node, child, XML_SCHEMAP_UNKNOWN_FACET_TYPE,
                       "Unknown facet type %s\n", node->name, NULL);
        xmlSchemaFreeFacet(facet);
        return (NULL);
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    facet->value = value;
    if ((facet->type != XML_SCHEMA_FACET_PATTERN) &&
	(facet->type != XML_SCHEMA_FACET_ENUMERATION)) {
	const xmlChar *fixed;

	fixed = xmlSchemaGetProp(ctxt, node, "fixed");
	if (fixed != NULL) {
	    if (xmlStrEqual(fixed, BAD_CAST "true"))
		facet->fixed = 1;
	}
    }
    child = node->children;

    if (IS_SCHEMA(child, "annotation")) {
        facet->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child != NULL) {
        xmlSchemaPErr2(ctxt, node, child, XML_SCHEMAP_UNKNOWN_FACET_CHILD,
                       "Facet %s has unexpected child content\n",
                       node->name, NULL);
    }
    return (facet);
}